

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O1

void __thiscall Display::addUserSetting(Display *this,string *setting)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_38 [2];
  long local_28 [2];
  
  if ((this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    local_38[0] = local_28;
    pcVar1 = (setting->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar1,pcVar1 + setting->_M_string_length);
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::_M_append((char *)&this->sUserSettings,(ulong)local_38[0]);
  }
  else {
    local_38[0] = local_28;
    pcVar1 = (setting->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar1,pcVar1 + setting->_M_string_length);
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::_M_append
              ((char *)&(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1].sUserSettings,(ulong)local_38[0]);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void Display::addUserSetting( string setting )
{
	if (vPlots.size())
		vPlots.back().sUserSettings += setting + "\n";
	else
		sUserSettings += setting + "\n";
}